

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O1

expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::usdc::USDCReader::Impl::ToAPISchemas
          (expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Impl *this,ListOp<tinyusdz::Token> *arg,bool ignore_unknown,
          string *warn)

{
  size_type *psVar1;
  pointer *pppVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pTVar4;
  pointer pTVar5;
  size_type sVar6;
  long *plVar7;
  undefined7 in_register_00000009;
  ListOp<tinyusdz::Token> *extraout_RDX;
  ListOp<tinyusdz::Token> *extraout_RDX_00;
  ListOp<tinyusdz::Token> *extraout_RDX_01;
  ListOp<tinyusdz::Token> *extraout_RDX_02;
  ListOp<tinyusdz::Token> *extraout_RDX_03;
  ListOp<tinyusdz::Token> *extraout_RDX_04;
  ListOp<tinyusdz::Token> *extraout_RDX_05;
  ListOp<tinyusdz::Token> *extraout_RDX_06;
  ListOp<tinyusdz::Token> *extraout_RDX_07;
  ListOp<tinyusdz::Token> *extraout_RDX_08;
  ListOp<tinyusdz::Token> *extraout_RDX_09;
  ListOp<tinyusdz::Token> *extraout_RDX_10;
  ListOp<tinyusdz::Token> *extraout_RDX_11;
  ListOp<tinyusdz::Token> *extraout_RDX_12;
  ListOp<tinyusdz::Token> *extraout_RDX_13;
  ListOp<tinyusdz::Token> *extraout_RDX_14;
  ListOp<tinyusdz::Token> *extraout_RDX_15;
  ListOp<tinyusdz::Token> *extraout_RDX_16;
  ListOp<tinyusdz::Token> *extraout_RDX_17;
  ListOp<tinyusdz::Token> *extraout_RDX_18;
  ListOp<tinyusdz::Token> *extraout_RDX_19;
  ListOp<tinyusdz::Token> *extraout_RDX_20;
  ListOp<tinyusdz::Token> *extraout_RDX_21;
  ListOp<tinyusdz::Token> *extraout_RDX_22;
  ListOp<tinyusdz::Token> *extraout_RDX_23;
  ListOp<tinyusdz::Token> *extraout_RDX_24;
  ListOp<tinyusdz::Token> *extraout_RDX_25;
  ListOp<tinyusdz::Token> *extraout_RDX_26;
  ListOp<tinyusdz::Token> *extraout_RDX_27;
  ListOp<tinyusdz::Token> *extraout_RDX_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 unaff_EBX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  const_iterator __begin4;
  const_iterator __begin5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  string instanceName;
  APISchemas schemas;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  undefined1 local_a0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_68;
  undefined4 local_5c;
  string *local_58;
  ListEditQual local_50;
  vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  local_5c = (undefined4)CONCAT71(in_register_00000009,ignore_unknown);
  local_50 = ResetToExplicit;
  local_48.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = warn;
  if (arg->is_explicit == true) {
    pbVar8 = &((arg->explicit_items).
               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
               super__Vector_impl_data._M_start)->str_;
    pbVar9 = &((arg->explicit_items).
               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
               super__Vector_impl_data._M_finish)->str_;
    local_68 = __return_storage_ptr__;
    if (pbVar8 != pbVar9) {
      paVar3 = &local_88.field_2;
      do {
        ToAPISchemas::anon_class_1_0_00000001::operator()
                  ((optional<tinyusdz::APISchemas::APIName> *)local_b0,
                   (anon_class_1_0_00000001 *)pbVar8,(token *)arg);
        if (local_b0[0] != MaterialBindingAPI) {
          unaff_EBX = local_b0._4_4_;
        }
        if (local_b0[0] == ConnectableAPI) {
          local_88._M_dataplus._M_p = (pointer)paVar3;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
          local_b0._0_4_ = unaff_EBX;
          local_a8._M_p = local_a0 + 8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,local_88._M_dataplus._M_p,
                     local_88._M_dataplus._M_p + local_88._M_string_length);
          ::std::
          vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
          ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                    ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                      *)&local_48,
                     (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_b0);
          arg = extraout_RDX;
          if (local_a8._M_p != local_a0 + 8) {
            operator_delete(local_a8._M_p,(ulong)(local_a0._8_8_ + 1));
            arg = extraout_RDX_00;
          }
        }
        else {
          if ((char)local_5c == '\0') {
            ::std::operator+(&local_88,"Invalid or Unsupported API schema: ",pbVar8);
            sVar6 = local_88._M_string_length;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p == paVar3) {
              local_a0._8_8_ = local_88.field_2._8_8_;
              local_b0 = (undefined1  [8])local_a0;
            }
            else {
              local_b0 = (undefined1  [8])local_88._M_dataplus._M_p;
            }
            local_a0._1_7_ = local_88.field_2._M_allocated_capacity._1_7_;
            local_a0[0] = local_88.field_2._M_local_buf[0];
            local_88._M_string_length = 0;
            local_88.field_2._M_local_buf[0] = '\0';
            (local_68->contained).
            super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value = false;
            pppVar2 = (pointer *)
                      ((long)&(local_68->contained).
                              super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0.m_value.names.
                              super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data + 8);
            *(pointer **)
             &(local_68->contained).
              super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0 = pppVar2;
            if (local_b0 == (undefined1  [8])local_a0) {
              *pppVar2 = (pointer)local_a0._0_8_;
              *(undefined8 *)
               ((long)&(local_68->contained).
                       super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0.m_value.names.
                       super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data + 0x10) = local_a0._8_8_;
            }
            else {
              (local_68->contained).
              super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_error._M_dataplus._M_p = (pointer)local_b0;
              *(undefined8 *)
               ((long)&(local_68->contained).
                       super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0.m_value.names.
                       super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data + 8) = local_a0._0_8_;
            }
            (local_68->contained).
            super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_error._M_string_length = sVar6;
            local_a8._M_p = (pointer)0x0;
            local_a0._0_8_ = (ulong)(uint7)local_88.field_2._M_allocated_capacity._1_7_ << 8;
            __return_storage_ptr__ = local_68;
            local_b0 = (undefined1  [8])local_a0;
            local_88._M_dataplus._M_p = (pointer)paVar3;
            goto LAB_00170f35;
          }
          ::std::operator+(&local_88,"Ignored unknown or unsupported API schema: ",pbVar8);
          plVar7 = (long *)::std::__cxx11::string::append((char *)&local_88);
          psVar1 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_a0._0_8_ = *psVar1;
            local_a0._8_8_ = plVar7[3];
            local_b0 = (undefined1  [8])local_a0;
          }
          else {
            local_a0._0_8_ = *psVar1;
            local_b0 = (undefined1  [8])*plVar7;
          }
          local_a8._M_p = (pointer)plVar7[1];
          *plVar7 = (long)psVar1;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_58,(ulong)local_b0);
          arg = extraout_RDX_02;
          if (local_b0 != (undefined1  [8])local_a0) {
            operator_delete((void *)local_b0,local_a0._0_8_ + 1);
            arg = extraout_RDX_03;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar3) {
          operator_delete(local_88._M_dataplus._M_p,
                          CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                   local_88.field_2._M_local_buf[0]) + 1);
          arg = extraout_RDX_01;
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != pbVar9);
    }
LAB_001708be:
    local_50 = ResetToExplicit;
  }
  else {
    __rhs = &((arg->explicit_items).
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_start)->str_;
    pbVar8 = &((arg->explicit_items).
               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
               super__Vector_impl_data._M_finish)->str_;
    pbVar9 = &((arg->added_items).
               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
               super__Vector_impl_data._M_finish)->str_;
    pbVar10 = &((arg->added_items).
                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_start)->str_;
    if (pbVar8 != __rhs) {
      if ((((pbVar9 != pbVar10) ||
           ((arg->appended_items).
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (arg->appended_items).
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_start)) ||
          ((arg->deleted_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (arg->deleted_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start)) ||
         (((arg->prepended_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (arg->prepended_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start ||
          ((arg->ordered_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (arg->ordered_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start)))) {
LAB_00170f1e:
        local_b0 = (undefined1  [8])0x3b4b25;
LAB_00170f25:
        nonstd::expected_lite::
        expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<const_char_*,_0>
                  (__return_storage_ptr__,(unexpected_type<const_char_*> *)local_b0);
        goto LAB_00170f35;
      }
      local_68 = __return_storage_ptr__;
      if (__rhs != pbVar8) {
        do {
          ToAPISchemas::anon_class_1_0_00000001::operator()
                    ((optional<tinyusdz::APISchemas::APIName> *)local_b0,
                     (anon_class_1_0_00000001 *)__rhs,(token *)arg);
          if (local_b0[0] != MaterialBindingAPI) {
            pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)local_b0 >> 0x20);
          }
          if (local_b0[0] == ConnectableAPI) {
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
            local_b0._0_4_ = (int)pbVar9;
            local_a8._M_p = local_a0 + 8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a8,local_88._M_dataplus._M_p,
                       local_88._M_dataplus._M_p + local_88._M_string_length);
            ::std::
            vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
            ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                      ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                        *)&local_48,
                       (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_b0);
            arg = extraout_RDX_04;
            if (local_a8._M_p != local_a0 + 8) {
              operator_delete(local_a8._M_p,(ulong)(local_a0._8_8_ + 1));
              arg = extraout_RDX_05;
            }
          }
          else {
            if ((char)local_5c == '\0') goto LAB_00171147;
            ::std::operator+(&local_88,"Ignored unknown or unsupported API schema: ",__rhs);
            plVar7 = (long *)::std::__cxx11::string::append((char *)&local_88);
            psVar1 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_a0._0_8_ = *psVar1;
              local_a0._8_8_ = plVar7[3];
              local_b0 = (undefined1  [8])local_a0;
            }
            else {
              local_a0._0_8_ = *psVar1;
              local_b0 = (undefined1  [8])*plVar7;
            }
            local_a8._M_p = (pointer)plVar7[1];
            *plVar7 = (long)psVar1;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_58,(ulong)local_b0);
            arg = extraout_RDX_07;
            if (local_b0 != (undefined1  [8])local_a0) {
              operator_delete((void *)local_b0,local_a0._0_8_ + 1);
              arg = extraout_RDX_08;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,
                            CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                     local_88.field_2._M_local_buf[0]) + 1);
            arg = extraout_RDX_06;
          }
          __rhs = __rhs + 1;
        } while (__rhs != pbVar8);
      }
      goto LAB_001708be;
    }
    __rhs = &((arg->appended_items).
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_start)->str_;
    pbVar8 = &((arg->appended_items).
               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
               super__Vector_impl_data._M_finish)->str_;
    if (pbVar9 == pbVar10) {
      pbVar9 = &((arg->deleted_items).
                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                 super__Vector_impl_data._M_start)->str_;
      pbVar10 = &((arg->deleted_items).
                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                  super__Vector_impl_data._M_finish)->str_;
      if (pbVar8 == __rhs) {
        __rhs = &((arg->prepended_items).
                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                  super__Vector_impl_data._M_start)->str_;
        pbVar8 = &((arg->prepended_items).
                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                   super__Vector_impl_data._M_finish)->str_;
        if (pbVar10 == pbVar9) {
          pTVar4 = (arg->ordered_items).
                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pTVar5 = (arg->ordered_items).
                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pbVar8 == __rhs) {
            if (pTVar5 == pTVar4) {
              local_b0 = (undefined1  [8])0x3b4b90;
            }
            else {
              local_b0 = (undefined1  [8])0x3b4b74;
            }
            goto LAB_00170f25;
          }
          if (pTVar5 != pTVar4) goto LAB_00170f1e;
          local_68 = __return_storage_ptr__;
          if (__rhs != pbVar8) {
            do {
              ToAPISchemas::anon_class_1_0_00000001::operator()
                        ((optional<tinyusdz::APISchemas::APIName> *)local_b0,
                         (anon_class_1_0_00000001 *)__rhs,(token *)arg);
              if (local_b0[0] != MaterialBindingAPI) {
                pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((ulong)local_b0 >> 0x20);
              }
              if (local_b0[0] == ConnectableAPI) {
                local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
                local_b0._0_4_ = (int)pbVar10;
                local_a8._M_p = local_a0 + 8;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_a8,local_88._M_dataplus._M_p,
                           local_88._M_dataplus._M_p + local_88._M_string_length);
                ::std::
                vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                          ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                            *)&local_48,
                           (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_b0);
                arg = extraout_RDX_24;
                if (local_a8._M_p != local_a0 + 8) {
                  operator_delete(local_a8._M_p,(ulong)(local_a0._8_8_ + 1));
                  arg = extraout_RDX_25;
                }
              }
              else {
                if ((char)local_5c == '\0') goto LAB_00171147;
                ::std::operator+(&local_88,"Ignored unknown or unsupported API schema: ",__rhs);
                plVar7 = (long *)::std::__cxx11::string::append((char *)&local_88);
                psVar1 = (size_type *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_a0._0_8_ = *psVar1;
                  local_a0._8_8_ = plVar7[3];
                  local_b0 = (undefined1  [8])local_a0;
                }
                else {
                  local_a0._0_8_ = *psVar1;
                  local_b0 = (undefined1  [8])*plVar7;
                }
                local_a8._M_p = (pointer)plVar7[1];
                *plVar7 = (long)psVar1;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_58,(ulong)local_b0);
                arg = extraout_RDX_27;
                if (local_b0 != (undefined1  [8])local_a0) {
                  operator_delete((void *)local_b0,local_a0._0_8_ + 1);
                  arg = extraout_RDX_28;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,
                                CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                         local_88.field_2._M_local_buf[0]) + 1);
                arg = extraout_RDX_26;
              }
              __rhs = __rhs + 1;
            } while (__rhs != pbVar8);
          }
          local_50 = Prepend;
        }
        else {
          if ((pbVar8 != __rhs) ||
             ((arg->ordered_items).
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (arg->ordered_items).
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_start)) goto LAB_00170f1e;
          local_68 = __return_storage_ptr__;
          if (pbVar9 != pbVar10) {
            __rhs = pbVar9;
            do {
              ToAPISchemas::anon_class_1_0_00000001::operator()
                        ((optional<tinyusdz::APISchemas::APIName> *)local_b0,
                         (anon_class_1_0_00000001 *)__rhs,(token *)arg);
              if (local_b0[0] != MaterialBindingAPI) {
                pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)local_b0 >> 0x20);
              }
              if (local_b0[0] == ConnectableAPI) {
                local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
                local_b0._0_4_ = (int)pbVar8;
                local_a8._M_p = local_a0 + 8;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_a8,local_88._M_dataplus._M_p,
                           local_88._M_dataplus._M_p + local_88._M_string_length);
                ::std::
                vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                          ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                            *)&local_48,
                           (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_b0);
                arg = extraout_RDX_19;
                if (local_a8._M_p != local_a0 + 8) {
                  operator_delete(local_a8._M_p,(ulong)(local_a0._8_8_ + 1));
                  arg = extraout_RDX_20;
                }
              }
              else {
                if ((char)local_5c == '\0') goto LAB_00171147;
                ::std::operator+(&local_88,"Ignored unknown or unsupported API schema: ",__rhs);
                plVar7 = (long *)::std::__cxx11::string::append((char *)&local_88);
                psVar1 = (size_type *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_a0._0_8_ = *psVar1;
                  local_a0._8_8_ = plVar7[3];
                  local_b0 = (undefined1  [8])local_a0;
                }
                else {
                  local_a0._0_8_ = *psVar1;
                  local_b0 = (undefined1  [8])*plVar7;
                }
                local_a8._M_p = (pointer)plVar7[1];
                *plVar7 = (long)psVar1;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_58,(ulong)local_b0);
                arg = extraout_RDX_22;
                if (local_b0 != (undefined1  [8])local_a0) {
                  operator_delete((void *)local_b0,local_a0._0_8_ + 1);
                  arg = extraout_RDX_23;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,
                                CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                         local_88.field_2._M_local_buf[0]) + 1);
                arg = extraout_RDX_21;
              }
              __rhs = __rhs + 1;
            } while (__rhs != pbVar10);
          }
          local_50 = Delete;
        }
      }
      else {
        if (((pbVar10 != pbVar9) ||
            ((arg->prepended_items).
             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             (arg->prepended_items).
             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_start)) ||
           ((arg->ordered_items).
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (arg->ordered_items).
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_start)) goto LAB_00170f1e;
        local_68 = __return_storage_ptr__;
        if (__rhs != pbVar8) {
          do {
            ToAPISchemas::anon_class_1_0_00000001::operator()
                      ((optional<tinyusdz::APISchemas::APIName> *)local_b0,
                       (anon_class_1_0_00000001 *)__rhs,(token *)arg);
            if (local_b0[0] != MaterialBindingAPI) {
              pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((ulong)local_b0 >> 0x20);
            }
            if (local_b0[0] == ConnectableAPI) {
              local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
              local_b0._0_4_ = (int)pbVar10;
              local_a8._M_p = local_a0 + 8;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a8,local_88._M_dataplus._M_p,
                         local_88._M_dataplus._M_p + local_88._M_string_length);
              ::std::
              vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
              ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                        ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                          *)&local_48,
                         (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_b0);
              arg = extraout_RDX_14;
              if (local_a8._M_p != local_a0 + 8) {
                operator_delete(local_a8._M_p,(ulong)(local_a0._8_8_ + 1));
                arg = extraout_RDX_15;
              }
            }
            else {
              if ((char)local_5c == '\0') goto LAB_00171147;
              ::std::operator+(&local_88,"Ignored unknown or unsupported API schema: ",__rhs);
              plVar7 = (long *)::std::__cxx11::string::append((char *)&local_88);
              psVar1 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_a0._0_8_ = *psVar1;
                local_a0._8_8_ = plVar7[3];
                local_b0 = (undefined1  [8])local_a0;
              }
              else {
                local_a0._0_8_ = *psVar1;
                local_b0 = (undefined1  [8])*plVar7;
              }
              local_a8._M_p = (pointer)plVar7[1];
              *plVar7 = (long)psVar1;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)local_58,(ulong)local_b0);
              arg = extraout_RDX_17;
              if (local_b0 != (undefined1  [8])local_a0) {
                operator_delete((void *)local_b0,local_a0._0_8_ + 1);
                arg = extraout_RDX_18;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,
                              CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                       local_88.field_2._M_local_buf[0]) + 1);
              arg = extraout_RDX_16;
            }
            __rhs = __rhs + 1;
          } while (__rhs != pbVar8);
        }
        local_50 = Append;
      }
    }
    else {
      if (((pbVar8 != __rhs) ||
          ((arg->deleted_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (arg->deleted_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start)) ||
         (((arg->prepended_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (arg->prepended_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start ||
          ((arg->ordered_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (arg->ordered_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start)))) goto LAB_00170f1e;
      local_68 = __return_storage_ptr__;
      if (pbVar10 != pbVar9) {
        __rhs = pbVar10;
        do {
          ToAPISchemas::anon_class_1_0_00000001::operator()
                    ((optional<tinyusdz::APISchemas::APIName> *)local_b0,
                     (anon_class_1_0_00000001 *)__rhs,(token *)arg);
          if (local_b0[0] != MaterialBindingAPI) {
            pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)local_b0 >> 0x20);
          }
          if (local_b0[0] == ConnectableAPI) {
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
            local_b0._0_4_ = (int)pbVar8;
            local_a8._M_p = local_a0 + 8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a8,local_88._M_dataplus._M_p,
                       local_88._M_dataplus._M_p + local_88._M_string_length);
            ::std::
            vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
            ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                      ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                        *)&local_48,
                       (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_b0);
            arg = extraout_RDX_09;
            if (local_a8._M_p != local_a0 + 8) {
              operator_delete(local_a8._M_p,(ulong)(local_a0._8_8_ + 1));
              arg = extraout_RDX_10;
            }
          }
          else {
            if ((char)local_5c == '\0') goto LAB_00171147;
            ::std::operator+(&local_88,"Ignored unknown or unsupported API schema: ",__rhs);
            plVar7 = (long *)::std::__cxx11::string::append((char *)&local_88);
            psVar1 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_a0._0_8_ = *psVar1;
              local_a0._8_8_ = plVar7[3];
              local_b0 = (undefined1  [8])local_a0;
            }
            else {
              local_a0._0_8_ = *psVar1;
              local_b0 = (undefined1  [8])*plVar7;
            }
            local_a8._M_p = (pointer)plVar7[1];
            *plVar7 = (long)psVar1;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_58,(ulong)local_b0);
            arg = extraout_RDX_12;
            if (local_b0 != (undefined1  [8])local_a0) {
              operator_delete((void *)local_b0,local_a0._0_8_ + 1);
              arg = extraout_RDX_13;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,
                            CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                     local_88.field_2._M_local_buf[0]) + 1);
            arg = extraout_RDX_11;
          }
          __rhs = __rhs + 1;
        } while (__rhs != pbVar9);
      }
      local_50 = Add;
    }
  }
  (local_68->contained).
  super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = true;
  (local_68->contained).
  super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value.listOpQual = local_50;
  (local_68->contained).
  super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value.names.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(local_68->contained).
           super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .field_0.m_value.names.
           super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data + 8) =
       local_48.
       super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(local_68->contained).
           super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .field_0.m_value.names.
           super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) =
       local_48.
       super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__ = local_68;
LAB_00170f35:
  ::std::
  vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48);
  return __return_storage_ptr__;
LAB_00171147:
  ::std::operator+(&local_88,"Invalid or Unsupported API schema: ",__rhs);
  sVar6 = local_88._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == &local_88.field_2) {
    local_a0._8_8_ = local_88.field_2._8_8_;
    local_b0 = (undefined1  [8])local_a0;
  }
  else {
    local_b0 = (undefined1  [8])local_88._M_dataplus._M_p;
  }
  local_a0._1_7_ = local_88.field_2._M_allocated_capacity._1_7_;
  local_a0[0] = local_88.field_2._M_local_buf[0];
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  (local_68->contained).
  super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = false;
  pppVar2 = (pointer *)
            ((long)&(local_68->contained).
                    super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .field_0.m_value.names.
                    super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  *(pointer **)
   &(local_68->contained).
    super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0 = pppVar2;
  if (local_b0 == (undefined1  [8])local_a0) {
    *pppVar2 = (pointer)local_a0._0_8_;
    *(undefined8 *)
     ((long)&(local_68->contained).
             super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0.m_value.names.
             super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data + 0x10) = local_a0._8_8_;
  }
  else {
    (local_68->contained).
    super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_dataplus._M_p = (pointer)local_b0;
    *(undefined8 *)
     ((long)&(local_68->contained).
             super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0.m_value.names.
             super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data + 8) = local_a0._0_8_;
  }
  (local_68->contained).
  super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_error._M_string_length = sVar6;
  local_a8._M_p = (pointer)0x0;
  local_a0._0_8_ = (ulong)(uint7)local_88.field_2._M_allocated_capacity._1_7_ << 8;
  __return_storage_ptr__ = local_68;
  local_b0 = (undefined1  [8])local_a0;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  goto LAB_00170f35;
}

Assistant:

nonstd::expected<APISchemas, std::string> USDCReader::Impl::ToAPISchemas(
    const ListOp<value::token> &arg, bool ignore_unknown, std::string &warn) {
  APISchemas schemas;

  auto SchemaHandler =
      [](const value::token &tok) -> nonstd::optional<APISchemas::APIName> {
    if (tok.str() == "MaterialBindingAPI") {
      return APISchemas::APIName::MaterialBindingAPI;
    } else if (tok.str() == "NodeDefAPI") {
      return APISchemas::APIName::NodeDefAPI;
    } else if (tok.str() == "CoordSysAPI") {
      return APISchemas::APIName::CoordSysAPI;
    } else if (tok.str() == "ConnectableAPI") {
      return APISchemas::APIName::ConnectableAPI;
    } else if (tok.str() == "CollectionAPI") {
      return APISchemas::APIName::CollectionAPI;
    } else if (tok.str() == "SkelBindingAPI") {
      return APISchemas::APIName::SkelBindingAPI;
    } else if (tok.str() == "VisibilityAPI") {
      return APISchemas::APIName::VisibilityAPI;
    } else if (tok.str() == "GeomModelAPI") {
      return APISchemas::APIName::GeomModelAPI;
    } else if (tok.str() == "MotionAPI") {
      return APISchemas::APIName::MotionAPI;
    } else if (tok.str() == "PrimvarsAPI") {
      return APISchemas::APIName::PrimvarsAPI;
    } else if (tok.str() == "XformCommonAPI") {
      return APISchemas::APIName::XformCommonAPI;
    } else if (tok.str() == "ListAPI") {
      return APISchemas::APIName::ListAPI;
    } else if (tok.str() == "LightListAPI") {
      return APISchemas::APIName::LightListAPI;
    } else if (tok.str() == "LightAPI") {
      return APISchemas::APIName::LightAPI;
    } else if (tok.str() == "MeshLightAPI") {
      return APISchemas::APIName::MeshLightAPI;
    } else if (tok.str() == "VolumeLightAPI") {
      return APISchemas::APIName::VolumeLightAPI;
    } else if (tok.str() == "ConnectableAPI") {
      return APISchemas::APIName::ConnectableAPI;
    } else if (tok.str() == "ShadowAPI") {
      return APISchemas::APIName::ShadowAPI;
    } else if (tok.str() == "ShapingAPI") {
      return APISchemas::APIName::ShapingAPI;
    } else if (tok.str() == "Preliminary_AnchoringAPI") {
      return APISchemas::APIName::Preliminary_AnchoringAPI;
    } else if (tok.str() == "Preliminary_PhysicsColliderAPI") {
      return APISchemas::APIName::Preliminary_PhysicsColliderAPI;
    } else if (tok.str() == "Preliminary_PhysicsMaterialAPI") {
      return APISchemas::APIName::Preliminary_PhysicsMaterialAPI;
    } else if (tok.str() == "Preliminary_PhysicsRigidBodyAPI") {
      return APISchemas::APIName::Preliminary_PhysicsRigidBodyAPI;
    } else {
      return nonstd::nullopt;
    }
  };

  if (arg.IsExplicit()) {  // fast path
    for (auto &item : arg.GetExplicitItems()) {
      if (auto pv = SchemaHandler(item)) {
        std::string instanceName = "";  // TODO
        schemas.names.push_back({pv.value(), instanceName});
      } else if (ignore_unknown) {
        warn += "Ignored unknown or unsupported API schema: " +
                                       item.str() + "\n";
      } else {
        return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                       item.str());
      }
    }
    schemas.listOpQual = ListEditQual::ResetToExplicit;

  } else {
    // Assume all items have same ListEdit qualifier.
    if (arg.GetExplicitItems().size()) {
      if (arg.GetAddedItems().size() || arg.GetAppendedItems().size() ||
          arg.GetDeletedItems().size() || arg.GetPrependedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &&item : arg.GetExplicitItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::ResetToExplicit;

    } else if (arg.GetAddedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAppendedItems().size() ||
          arg.GetDeletedItems().size() || arg.GetPrependedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &item : arg.GetAddedItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::Add;
    } else if (arg.GetAppendedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAddedItems().size() ||
          arg.GetDeletedItems().size() || arg.GetPrependedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &&item : arg.GetAppendedItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::Append;
    } else if (arg.GetDeletedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAddedItems().size() ||
          arg.GetAppendedItems().size() || arg.GetPrependedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &&item : arg.GetDeletedItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::Delete;
    } else if (arg.GetPrependedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAddedItems().size() ||
          arg.GetAppendedItems().size() || arg.GetDeletedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &&item : arg.GetPrependedItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::Prepend;
    } else if (arg.GetOrderedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAddedItems().size() ||
          arg.GetAppendedItems().size() || arg.GetDeletedItems().size() ||
          arg.GetPrependedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }

      // schemas.qual = ListEditQual::Order;
      return nonstd::make_unexpected("TODO: Ordered ListOp items.");
    } else {
      // ??? This should not happend.
      return nonstd::make_unexpected("Internal error: ListOp conversion.");
    }
  }

  return std::move(schemas);
}